

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_compiled.cpp
# Opt level: O0

void __thiscall
randomx::CompiledVm<randomx::LargePageAllocator,_false,_false>::CompiledVm
          (CompiledVm<randomx::LargePageAllocator,_false,_false> *this)

{
  undefined8 *in_RDI;
  JitCompilerX86 *unaff_retaddr;
  VmBase<randomx::LargePageAllocator,_false> *in_stack_ffffffffffffffe0;
  
  VmBase<randomx::LargePageAllocator,_false>::VmBase(in_stack_ffffffffffffffe0);
  *in_RDI = &PTR__CompiledVm_00162d18;
  JitCompilerX86::JitCompilerX86(unaff_retaddr);
  JitCompilerX86::enableAll((JitCompilerX86 *)0x13eb7c);
  return;
}

Assistant:

CompiledVm<Allocator, softAes, secureJit>::CompiledVm() {
		if (!secureJit) {
			compiler.enableAll(); //make JIT buffer both writable and executable
		}
	}